

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS
ref_grid_compact_cell_id_nodes
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_INT cell_id,REF_GLOB *nnode_global,
          REF_LONG *ncell_global,REF_GLOB **l2c)

{
  size_t __size;
  int iVar1;
  int iVar2;
  REF_INT *pRVar3;
  REF_MPI pRVar4;
  long lVar5;
  bool bVar6;
  REF_STATUS RVar7;
  uint uVar8;
  REF_GLOB *pRVar9;
  void *array;
  int iVar10;
  long lVar11;
  REF_GLOB RVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  REF_INT nnode;
  REF_INT part;
  REF_INT nodes [27];
  uint local_d8;
  int local_d4;
  REF_MPI local_d0;
  REF_NODE local_c8;
  REF_INT local_c0;
  int local_bc;
  long *local_b8;
  REF_GLOB *local_b0;
  REF_INT local_a8 [30];
  
  local_d0 = ref_grid->mpi;
  local_c8 = ref_grid->node;
  iVar13 = local_c8->max;
  local_c0 = cell_id;
  local_b8 = ncell_global;
  if ((long)iVar13 < 0) {
    bVar6 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x223,
           "ref_grid_compact_cell_id_nodes","malloc *l2c of REF_GLOB negative");
    local_d8 = 1;
  }
  else {
    __size = (long)iVar13 * 8;
    pRVar9 = (REF_GLOB *)malloc(__size);
    *l2c = pRVar9;
    if (pRVar9 == (REF_GLOB *)0x0) {
      bVar6 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x223,
             "ref_grid_compact_cell_id_nodes","malloc *l2c of REF_GLOB NULL");
      local_d8 = 2;
    }
    else {
      bVar6 = true;
      if (iVar13 != 0) {
        memset(pRVar9,0xff,__size);
      }
    }
  }
  if (bVar6) {
    lVar14 = 0;
    *nnode_global = 0;
    *local_b8 = 0;
    local_d4 = 0;
    if (0 < ref_cell->max) {
      iVar13 = 0;
      iVar15 = 0;
      local_b0 = nnode_global;
      do {
        RVar7 = ref_cell_nodes(ref_cell,iVar13,local_a8);
        if ((RVar7 == 0) && (local_a8[ref_cell->node_per] == local_c0)) {
          uVar8 = ref_cell_part(ref_cell,local_c8,iVar13,&local_bc);
          if (uVar8 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x22c,"ref_grid_compact_cell_id_nodes",(ulong)uVar8,"part");
            return uVar8;
          }
          iVar15 = iVar15 + (uint)(local_d0->id == local_bc);
          iVar1 = ref_cell->node_per;
          if (0 < (long)iVar1) {
            pRVar3 = local_c8->part;
            pRVar4 = local_c8->ref_mpi;
            lVar14 = 0;
            iVar10 = local_d4;
            do {
              iVar2 = local_a8[lVar14];
              if ((pRVar4->id == pRVar3[iVar2]) && ((*l2c)[iVar2] == -1)) {
                (*l2c)[iVar2] = (long)iVar10;
                iVar10 = iVar10 + 1;
                local_d4 = iVar10;
              }
              lVar14 = lVar14 + 1;
            } while (iVar1 != lVar14);
          }
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 < ref_cell->max);
      lVar14 = (long)iVar15;
      nnode_global = local_b0;
    }
    *local_b8 = lVar14;
    local_d8 = ref_mpi_allsum(local_d0,local_b8,1,2);
    if (local_d8 == 0) {
      if ((long)local_d0->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x23d,"ref_grid_compact_cell_id_nodes","malloc counts of REF_INT negative");
        local_d8 = 1;
      }
      else {
        array = malloc((long)local_d0->n << 2);
        if (array == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x23d,"ref_grid_compact_cell_id_nodes","malloc counts of REF_INT NULL");
          local_d8 = 2;
        }
        else {
          local_d8 = ref_mpi_allgather(local_d0,&local_d4,array,1);
          if (local_d8 == 0) {
            lVar14 = 0;
            if (0 < (long)local_d0->id) {
              lVar11 = 0;
              do {
                lVar14 = (long)(int)lVar14 + (long)*(int *)((long)array + lVar11 * 4);
                lVar11 = lVar11 + 1;
              } while (local_d0->id != lVar11);
            }
            if (0 < (long)local_d0->n) {
              RVar12 = *nnode_global;
              lVar11 = 0;
              do {
                RVar12 = RVar12 + *(int *)((long)array + lVar11 * 4);
                lVar11 = lVar11 + 1;
              } while (local_d0->n != lVar11);
              *nnode_global = RVar12;
            }
            free(array);
            iVar13 = local_c8->max;
            if (0 < (long)iVar13) {
              pRVar9 = *l2c;
              lVar11 = 0;
              do {
                lVar5 = pRVar9[lVar11];
                if (lVar5 != -1) {
                  pRVar9[lVar11] = lVar5 + lVar14;
                }
                lVar11 = lVar11 + 1;
              } while (iVar13 != lVar11);
            }
            local_d8 = ref_node_ghost_glob(local_c8,*l2c,1);
            if (local_d8 == 0) {
              local_d8 = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x24c,"ref_grid_compact_cell_id_nodes",(ulong)local_d8,"xfer");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x23e,"ref_grid_compact_cell_id_nodes",(ulong)local_d8,"gather size");
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x23b,
             "ref_grid_compact_cell_id_nodes",(ulong)local_d8,"allsum");
    }
  }
  return local_d8;
}

Assistant:

REF_FCN REF_STATUS ref_grid_compact_cell_id_nodes(
    REF_GRID ref_grid, REF_CELL ref_cell, REF_INT cell_id,
    REF_GLOB *nnode_global, REF_LONG *ncell_global, REF_GLOB **l2c) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT cell, node, cell_node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_INT offset;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        ncell++;
      }
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (ref_node_owned(ref_node, nodes[cell_node]) &&
            (REF_EMPTY == (*l2c)[nodes[cell_node]])) {
          (*l2c)[nodes[cell_node]] = nnode;
          nnode++;
        }
      }
    }
  }

  (*ncell_global) = ncell;
  RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
    offset += counts[proc];
  }
  each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }